

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setTime(QDateTimeEdit *this,QTime time)

{
  QDate date;
  char cVar1;
  QTime time_00;
  long in_FS_OFFSET;
  undefined1 local_50 [12];
  QTime time_local;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  date.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  time_local = time;
  cVar1 = QTime::isValid();
  if (cVar1 != '\0') {
    (**(code **)(*(long *)date.jd + 0xf8))(date.jd);
    time_00.mds = ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue((QDateTimeEditPrivate *)local_50,date,time_00);
    ::QVariant::QVariant(&local_40,(QDateTime *)local_50);
    QAbstractSpinBoxPrivate::setValue
              ((QAbstractSpinBoxPrivate *)date.jd,&local_40,EmitIfChanged,true);
    ::QVariant::~QVariant(&local_40);
    QDateTime::~QDateTime((QDateTime *)local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setTime(QTime time)
{
    Q_D(QDateTimeEdit);
    if (time.isValid()) {
        d->clearCache();
        d->setValue(d->dateTimeValue(d->value.toDate(), time), EmitIfChanged);
    }
}